

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O2

int32 ps_lattice_posterior_prune(ps_lattice_t *dag,int32 beam)

{
  ps_latnode_s *ppVar1;
  latlink_list_s *plVar2;
  ps_latlink_t *elem;
  latlink_list_t *plVar3;
  latlink_list_t *plVar4;
  int iVar5;
  
  elem = ps_lattice_traverse_edges(dag,dag->start,dag->end);
  iVar5 = 0;
  while (elem != (ps_latlink_t *)0x0) {
    ppVar1 = elem->from;
    ppVar1->reachable = 0;
    if ((elem->beta + elem->alpha) - dag->norm < beam) {
      plVar2 = ppVar1->exits;
      plVar4 = (latlink_list_t *)0x0;
      while (plVar3 = plVar2, plVar3 != (latlink_list_t *)0x0) {
        plVar2 = plVar3->next;
        if (plVar3->link == elem) {
          __listelem_free__(dag->latlink_list_alloc,plVar3,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                            ,0x604);
        }
        else {
          plVar3->next = plVar4;
          plVar4 = plVar3;
        }
      }
      elem->from->exits = plVar4;
      plVar2 = elem->to->entries;
      plVar4 = (latlink_list_t *)0x0;
      while (plVar3 = plVar2, plVar3 != (latlink_list_t *)0x0) {
        plVar2 = plVar3->next;
        if (plVar3->link == elem) {
          __listelem_free__(dag->latlink_list_alloc,plVar3,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                            ,0x610);
        }
        else {
          plVar3->next = plVar4;
          plVar4 = plVar3;
        }
      }
      elem->to->entries = plVar4;
      __listelem_free__(dag->latlink_alloc,elem,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                        ,0x618);
      iVar5 = iVar5 + 1;
    }
    elem = ps_lattice_traverse_next(dag,dag->end);
  }
  dag_mark_reachable(dag->end);
  ps_lattice_delete_unreachable(dag);
  return iVar5;
}

Assistant:

int32
ps_lattice_posterior_prune(ps_lattice_t *dag, int32 beam)
{
    ps_latlink_t *link;
    int npruned = 0;

    for (link = ps_lattice_traverse_edges(dag, dag->start, dag->end);
         link; link = ps_lattice_traverse_next(dag, dag->end)) {
        link->from->reachable = FALSE;
        if (link->alpha + link->beta - dag->norm < beam) {
            latlink_list_t *x, *tmp, *next;
            tmp = NULL;
            for (x = link->from->exits; x; x = next) {
                next = x->next;
                if (x->link == link) {
                    listelem_free(dag->latlink_list_alloc, x);
                }
                else {
                    x->next = tmp;
                    tmp = x;
                }
            }
            link->from->exits = tmp;
            tmp = NULL;
            for (x = link->to->entries; x; x = next) {
                next = x->next;
                if (x->link == link) {
                    listelem_free(dag->latlink_list_alloc, x);
                }
                else {
                    x->next = tmp;
                    tmp = x;
                }
            }
            link->to->entries = tmp;
            listelem_free(dag->latlink_alloc, link);
            ++npruned;
        }
    }
    dag_mark_reachable(dag->end);
    ps_lattice_delete_unreachable(dag);
    return npruned;
}